

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O1

void CB_EXPLORE::finish(cb_explore *data)

{
  uint *__ptr;
  float *__ptr_00;
  
  __ptr = (data->preds)._begin;
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  (data->preds)._begin = (uint *)0x0;
  (data->preds)._end = (uint *)0x0;
  (data->preds).end_array = (uint *)0x0;
  __ptr_00 = (data->cover_probs)._begin;
  if (__ptr_00 != (float *)0x0) {
    free(__ptr_00);
  }
  (data->cover_probs)._begin = (float *)0x0;
  (data->cover_probs)._end = (float *)0x0;
  (data->cover_probs).end_array = (float *)0x0;
  (*(code *)PTR_delete_label_002d0a58)(&(data->cbcs).pred_scores);
  (*(code *)PTR_delete_label_002d0a58)(&data->cs_label);
  (*(code *)PTR_delete_label_002d0a58)(&data->second_cs_label);
  return;
}

Assistant:

void finish(cb_explore& data)
{
  data.preds.delete_v();
  data.cover_probs.delete_v();
  cb_to_cs& c = data.cbcs;
  COST_SENSITIVE::cs_label.delete_label(&c.pred_scores);
  COST_SENSITIVE::cs_label.delete_label(&data.cs_label);
  COST_SENSITIVE::cs_label.delete_label(&data.second_cs_label);
}